

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

size_t Node_MaxDataSize(node *p,dataid Id,dataflags Flags,int QueryType)

{
  ulong uVar1;
  node *local_38;
  size_t Size;
  int QueryType_local;
  dataflags Flags_local;
  dataid Id_local;
  node *p_local;
  
  if (((QueryType != 0x28) && (QueryType != 0x29)) && (QueryType != 0x2a)) {
    __assert_fail("QueryType==META_PARAM_GET || QueryType==META_PARAM_SET || QueryType==META_PARAM_UNSET"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x7ae,"size_t Node_MaxDataSize(node *, dataid, dataflags, int)");
  }
  uVar1 = Flags & 0x3f;
  if (uVar1 == 0) {
    p_local = (node *)0x0;
  }
  else {
    if (0x29 < uVar1) {
      __assert_fail("Flags < MAX_PARAMTYPE",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                    ,0x7b4,"size_t Node_MaxDataSize(node *, dataid, dataflags, int)");
    }
    local_38 = (node *)(ulong)ParamSize[uVar1];
    if ((local_38 == (node *)0x100) && (uVar1 != 4)) {
      if (p == (node *)0x0) {
        __assert_fail("(const void*)(p)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x7b8,"size_t Node_MaxDataSize(node *, dataid, dataflags, int)");
      }
      local_38 = (node *)(**(code **)((long)p->VMT + 0x30))(p,Id,0x27);
      if (local_38 == (node *)0x0) {
        local_38 = (node *)0x100;
      }
    }
    p_local = local_38;
  }
  return (size_t)p_local;
}

Assistant:

NOINLINE size_t Node_MaxDataSize(node* p, dataid Id, dataflags Flags, int QueryType)
{
    size_t Size;
    assert(QueryType==META_PARAM_GET || QueryType==META_PARAM_SET || QueryType==META_PARAM_UNSET);
    Flags &= TYPE_MASK;
    //assert(Flags != 0);
    if (Flags == 0)
        return 0;

    assert(Flags < MAX_PARAMTYPE);
    Size = ParamSize[Flags];
    if (Size == MAXDATA && Flags != TYPE_STRING) // we don't care about how much space the non-dynamic string needs (except in MetaSet())
    {
        Size = (size_t)Node_Meta(p,Id,META_PARAM_SIZE);
        if (!Size)
            Size = MAXDATA;
    }
    return Size;
}